

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O0

void __thiscall nigel::AstExpr::~AstExpr(AstExpr *this)

{
  AstExpr *this_local;
  
  this->_vptr_AstExpr = (_func_int **)&PTR__AstExpr_002b54a0;
  std::shared_ptr<nigel::Token>::~shared_ptr(&this->token);
  std::enable_shared_from_this<nigel::AstExpr>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<nigel::AstExpr>);
  return;
}

Assistant:

virtual ~AstExpr() {}